

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O2

void __thiscall
Fl_Text_Display::find_wrap_range
          (Fl_Text_Display *this,char *deletedText,int pos,int nInserted,int nDeleted,
          int *modRangeStart,int *modRangeEnd,int *linesInserted,int *linesDeleted)

{
  uint uVar1;
  uint styleBufOffset;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Fl_Text_Buffer *pFVar5;
  int *piVar6;
  ulong uVar7;
  undefined4 in_register_00000084;
  uint startPos;
  int iVar8;
  int iVar9;
  int retLineEnd;
  int retPos;
  ulong local_78;
  int *local_70;
  int retLineStart;
  long local_60;
  int *local_58;
  undefined8 local_50;
  ulong local_48;
  char *local_40;
  int retLines;
  
  local_50 = CONCAT44(in_register_00000084,nDeleted);
  pFVar5 = this->mBuffer;
  uVar1 = this->mNVisibleLines;
  uVar7 = (ulong)uVar1;
  local_58 = this->mLineStarts;
  local_40 = deletedText;
  if ((pos < this->mFirstChar) || (this->mLastChar < pos)) {
LAB_001cf6e1:
    styleBufOffset = Fl_Text_Buffer::line_start(pFVar5,pos);
    uVar7 = 0;
  }
  else {
    piVar6 = local_58 + uVar7;
    do {
      piVar6 = piVar6 + -1;
      iVar8 = (int)uVar7;
      if (iVar8 < 2) goto LAB_001cf6e1;
      uVar7 = (ulong)(iVar8 - 1);
    } while (pos < *piVar6 || *piVar6 == -1);
    uVar7 = (ulong)(iVar8 - 2);
    styleBufOffset = local_58[uVar7];
  }
  local_60 = (long)(int)uVar1;
  *modRangeStart = styleBufOffset;
  uVar2 = pos + nInserted;
  piVar6 = &retLines;
  local_78 = (ulong)(uint)pos;
  local_70 = modRangeStart;
  local_48 = (ulong)(uint)nInserted;
LAB_001cf71f:
  iVar8 = 0;
  startPos = styleBufOffset;
  do {
    wrapped_line_counter
              (this,pFVar5,startPos,pFVar5->mLength,1,true,0,&retPos,piVar6,&retLineStart,
               &retLineEnd,true);
    startPos = retPos;
    iVar3 = pFVar5->mLength;
    if (iVar3 <= retPos) {
      *modRangeEnd = iVar3;
      iVar8 = iVar8 + (uint)(retPos != retLineEnd);
LAB_001cf8b2:
      *linesInserted = iVar8;
      if (this->mSuppressResync == 0) {
        iVar9 = (int)local_78 - styleBufOffset;
        iVar8 = (int)local_50;
        iVar3 = (iVar3 - uVar2) + iVar9 + iVar8;
        pFVar5 = (Fl_Text_Buffer *)operator_new(0x88);
        Fl_Text_Buffer::Fl_Text_Buffer(pFVar5,iVar3,0x400);
        Fl_Text_Buffer::copy
                  (pFVar5,(EVP_PKEY_CTX *)this->mBuffer,(EVP_PKEY_CTX *)(ulong)styleBufOffset);
        if (iVar8 != 0) {
          Fl_Text_Buffer::insert(pFVar5,iVar9,local_40);
        }
        Fl_Text_Buffer::copy(pFVar5,(EVP_PKEY_CTX *)this->mBuffer,(EVP_PKEY_CTX *)(ulong)uVar2);
        wrapped_line_counter
                  (this,pFVar5,0,iVar3,0x7fffffff,true,styleBufOffset,&retPos,piVar6,&retLineStart,
                   &retLineEnd,false);
        Fl_Text_Buffer::~Fl_Text_Buffer(pFVar5);
        operator_delete(pFVar5,0x88);
      }
      else {
        piVar6 = &this->mNLinesDeleted;
      }
      *linesDeleted = *piVar6;
      this->mSuppressResync = 0;
      return;
    }
    iVar8 = iVar8 + 1;
    if ((int)uVar2 < retPos) {
      iVar3 = Fl_Text_Buffer::prev_char(pFVar5,retPos);
      uVar4 = Fl_Text_Buffer::char_at(pFVar5,iVar3);
      if (uVar4 == 10) {
        *modRangeEnd = startPos;
        iVar3 = startPos;
        goto LAB_001cf8b2;
      }
    }
    if (this->mSuppressResync == 0) {
      if ((int)local_78 < (int)startPos) {
        if ((int)uVar2 < (int)startPos) {
          iVar3 = (startPos - (int)local_48) + (int)local_50;
          for (uVar7 = (ulong)(int)uVar7; (long)uVar7 < local_60; uVar7 = uVar7 + 1) {
            iVar9 = local_58[uVar7];
            if (iVar3 <= iVar9) {
              if (iVar9 == iVar3 && iVar9 != -1) {
                iVar3 = line_end(this,startPos,true);
                *modRangeEnd = startPos;
                goto LAB_001cf8b2;
              }
              break;
            }
          }
        }
      }
      else {
        for (uVar7 = (ulong)(int)uVar7; (long)uVar7 < local_60; uVar7 = uVar7 + 1) {
          if ((int)startPos <= local_58[uVar7]) {
            if (local_58[uVar7] == startPos) {
              iVar3 = (int)uVar7 + 1;
              iVar8 = startPos;
              if ((iVar3 < (int)uVar1) && (local_58[iVar3] != -1)) {
                iVar8 = Fl_Text_Buffer::prev_char(pFVar5,local_58[iVar3]);
                if ((int)local_78 < iVar8) {
                  iVar8 = (int)local_78;
                }
              }
              *local_70 = iVar8;
              styleBufOffset = startPos;
              goto LAB_001cf71f;
            }
            break;
          }
        }
        iVar3 = *local_70;
        iVar9 = Fl_Text_Buffer::prev_char(pFVar5,startPos);
        if (iVar3 < iVar9) {
          iVar9 = iVar3;
        }
        *local_70 = iVar9;
      }
    }
  } while( true );
}

Assistant:

void Fl_Text_Display::find_wrap_range(const char *deletedText, int pos,
                                      int nInserted, int nDeleted,
                                      int *modRangeStart, int *modRangeEnd,
                                      int *linesInserted, int *linesDeleted) {
  IS_UTF8_ALIGNED(deletedText)
  IS_UTF8_ALIGNED2(buffer(), pos)

  int length, retPos, retLines, retLineStart, retLineEnd;
  Fl_Text_Buffer *deletedTextBuf, *buf = buffer();
  int nVisLines = mNVisibleLines;
  int *lineStarts = mLineStarts;
  int countFrom, countTo, lineStart, adjLineStart, i;
  int visLineNum = 0, nLines = 0;

  /*
   ** Determine where to begin searching: either the previous newline, or
   ** if possible, limit to the start of the (original) previous displayed
   ** line, using information from the existing line starts array
   */
  if (pos >= mFirstChar && pos <= mLastChar) {
    for (i=nVisLines-1; i>0; i--) {
      if (lineStarts[i] != -1 && pos >= lineStarts[i]) {
        break;
      }
    }
    if (i > 0) {
      countFrom = lineStarts[i-1];
      visLineNum = i-1;
    } else {
      countFrom = buf->line_start(pos);
    }
  } else {
    countFrom = buf->line_start(pos);
  }

  IS_UTF8_ALIGNED2(buf, countFrom)

  /*
   ** Move forward through the (new) text one line at a time, counting
   ** displayed lines, and looking for either a real newline, or for the
   ** line starts to re-sync with the original line starts array
   */
  lineStart = countFrom;
  *modRangeStart = countFrom;
  for (;;) {

    /* advance to the next line.  If the line ended in a real newline
     or the end of the buffer, that's far enough */
    wrapped_line_counter(buf, lineStart, buf->length(), 1, true, 0,
                         &retPos, &retLines, &retLineStart, &retLineEnd);
    if (retPos >= buf->length()) {
      countTo = buf->length();
      *modRangeEnd = countTo;
      if (retPos != retLineEnd)
        nLines++;
      break;
    } else {
      lineStart = retPos;
    }
    nLines++;
    if (lineStart > pos + nInserted && buf->char_at(buf->prev_char(lineStart)) == '\n') {
      countTo = lineStart;
      *modRangeEnd = lineStart;
      break;
    }

    /* Don't try to resync in continuous wrap mode with non-fixed font
     sizes; it would result in a chicken-and-egg dependency between
     the calculations for the inserted and the deleted lines.
     If we're in that mode, the number of deleted lines is calculated in
     advance, without resynchronization, so we shouldn't resynchronize
     for the inserted lines either. */
    if (mSuppressResync)
      continue;

    /* check for synchronization with the original line starts array
     before pos, if so, the modified range can begin later */
    if (lineStart <= pos) {
      while (visLineNum<nVisLines && lineStarts[visLineNum] < lineStart)
        visLineNum++;
      if (visLineNum < nVisLines && lineStarts[visLineNum] == lineStart) {
        countFrom = lineStart;
        nLines = 0;
        if (visLineNum+1 < nVisLines && lineStarts[visLineNum+1] != -1)
          *modRangeStart = min(pos, buf->prev_char(lineStarts[visLineNum+1]));
        else
          *modRangeStart = countFrom;
      } else
        *modRangeStart = min(*modRangeStart, buf->prev_char(lineStart));
    }

    /* check for synchronization with the original line starts array
     after pos, if so, the modified range can end early */
    else if (lineStart > pos + nInserted) {
      adjLineStart = lineStart - nInserted + nDeleted;
      while (visLineNum<nVisLines && lineStarts[visLineNum]<adjLineStart)
        visLineNum++;
      if (visLineNum < nVisLines && lineStarts[visLineNum] != -1 &&
          lineStarts[visLineNum] == adjLineStart) {
        countTo = line_end(lineStart, true);
        *modRangeEnd = lineStart;
        break;
      }
    }
  }
  *linesInserted = nLines;


  /* Count deleted lines between countFrom and countTo as the text existed
   before the modification (that is, as if the text between pos and
   pos+nInserted were replaced by "deletedText").  This extra context is
   necessary because wrapping can occur outside of the modified region
   as a result of adding or deleting text in the region. This is done by
   creating a textBuffer containing the deleted text and the necessary
   additional context, and calling the wrappedLineCounter on it.

   NOTE: This must not be done in continuous wrap mode when the font
   width is not fixed. In that case, the calculation would try
   to access style information that is no longer available (deleted
   text), or out of date (updated highlighting), possibly leading
   to completely wrong calculations and/or even crashes eventually.
   (This is not theoretical; it really happened.)

   In that case, the calculation of the number of deleted lines
   has happened before the buffer was modified (only in that case,
   because resynchronization of the line starts is impossible
   in that case, which makes the whole calculation less efficient).
   */
  if (mSuppressResync) {
    *linesDeleted = mNLinesDeleted;
    mSuppressResync = 0;
    return;
  }

  length = (pos-countFrom) + nDeleted +(countTo-(pos+nInserted));
  deletedTextBuf = new Fl_Text_Buffer(length);
  deletedTextBuf->copy(buffer(), countFrom, pos, 0);
  if (nDeleted != 0)
    deletedTextBuf->insert(pos-countFrom, deletedText);
  deletedTextBuf->copy(buffer(), pos+nInserted, countTo, pos-countFrom+nDeleted);
  /* Note that we need to take into account an offset for the style buffer:
   the deletedTextBuf can be out of sync with the style buffer. */
  wrapped_line_counter(deletedTextBuf, 0, length, INT_MAX, true, countFrom,
                       &retPos, &retLines, &retLineStart, &retLineEnd, false);
  delete deletedTextBuf;
  *linesDeleted = retLines;
  mSuppressResync = 0;
}